

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O0

bool __thiscall ELFIO::elfio::save(elfio *this,string *file_name)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  long local_220;
  ofstream stream;
  string *file_name_local;
  elfio *this_local;
  
  std::ofstream::ofstream(&local_220);
  _Var2 = std::__cxx11::string::c_str();
  std::operator|(_S_out,_S_bin);
  std::ofstream::open((char *)&local_220,_Var2);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) == 0) {
    this_local._7_1_ = save(this,(ostream *)&local_220);
  }
  else {
    this_local._7_1_ = false;
  }
  std::ofstream::~ofstream(&local_220);
  return this_local._7_1_;
}

Assistant:

bool save( const std::string& file_name )
    {
        std::ofstream stream;
        stream.open( file_name.c_str(), std::ios::out | std::ios::binary );
        if ( !stream ) {
            return false;
        }

        return save( stream );
    }